

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeriesInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
          (InversePowerSeriesInteractionType *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *series)

{
  bool bVar1;
  NonBondedInteractionType *in_RDI;
  iterator it;
  pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> *in_stack_ffffffffffffff98;
  NonBondedInteractionType *in_stack_ffffffffffffffa0;
  NonBondedInteractionType *__x;
  pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> *this_00;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_18 [3];
  
  NonBondedInteractionType::NonBondedInteractionType(in_stack_ffffffffffffffa0);
  in_RDI->_vptr_NonBondedInteractionType =
       (_func_int **)&PTR__InversePowerSeriesInteractionType_0033ffc0;
  __x = in_RDI + 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x221f23);
  this_00 = &in_RDI[1].atomTypes_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x221f36);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x221f44);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x221f52);
  __gnu_cxx::
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  ::__normal_iterator(local_18);
  local_18[0]._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 = in_RDI + 1;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator*(local_18);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,(value_type_conflict1 *)__x);
    in_stack_ffffffffffffff98 = &in_RDI[1].atomTypes_;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator*(local_18);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict2 *)__x);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(local_18);
  }
  NonBondedInteractionType::setInversePowerSeries(in_RDI);
  return;
}

Assistant:

InversePowerSeriesInteractionType(
        std::vector<std::pair<int, RealType>> series) {
      powers.clear();
      coefficients.clear();

      std::vector<std::pair<int, RealType>>::iterator it;

      for (it = series.begin(); it != series.end(); ++it) {
        powers.push_back((*it).first);
        coefficients.push_back((*it).second);
      }

      setInversePowerSeries();
    }